

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase100::run(TestCase100 *this)

{
  int *callCount_00;
  Builder builder;
  PromiseNode *pPVar1;
  CapTableBuilder *pCVar2;
  AsyncIoStream *pAVar3;
  long *plVar4;
  AsyncIoProvider *pAVar5;
  WirePointer *pWVar6;
  RequestHook *pRVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  TransformPromiseNodeBase *this_00;
  size_t __n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int iVar10;
  bool bVar11;
  Client CVar12;
  Reader RVar13;
  ReaderOptions receiveOptions;
  bool barFailed;
  int callCount;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_twoparty_test_c__:126:7),_capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_>
  promise3;
  PipeThread serverThread;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response1;
  AsyncIoContext ioContext;
  RemotePromise<capnproto_test::capnp::test::TestInterface::BazResults> promise2;
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> promise1;
  RpcSystem<capnp::rpc::twoparty::VatId> rpcClient;
  int handleCount;
  Request<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  request2;
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  request3;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request1;
  Response<capnproto_test::capnp::test::TestInterface::BazResults> response2;
  TwoPartyVatNetwork network;
  undefined1 local_5a5 [5];
  Own<kj::_::PromiseNode> local_5a0;
  undefined1 local_590 [16];
  CapTableBuilder *pCStack_580;
  PipeThread local_578;
  Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> local_558;
  WirePointer *local_540;
  short local_534;
  int local_530;
  undefined8 *local_528;
  long *local_520;
  undefined8 *local_510;
  long *local_508;
  undefined8 *local_500;
  AsyncIoProvider *local_4f8;
  WaitScope *local_4f0;
  SegmentBuilder *local_4e0;
  CapTableBuilder *local_4d8;
  undefined8 *local_4d0;
  WirePointer *local_4c8;
  long in_stack_fffffffffffffb40;
  Disposer *in_stack_fffffffffffffb48;
  RequestHook *in_stack_fffffffffffffb50;
  SegmentBuilder *in_stack_fffffffffffffb58;
  CapTableBuilder *in_stack_fffffffffffffb60;
  undefined8 *local_498;
  WirePointer *local_490;
  long local_488;
  Disposer *pDStack_480;
  RequestHook *local_478;
  RpcSystemBase local_470;
  int local_45c;
  Request<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  local_458;
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  local_420;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_3e8;
  ArrayPtr<const_char> local_3b0 [3];
  undefined8 *local_380;
  long *local_378;
  StructBuilder local_370;
  ExceptionOrValue local_348;
  char local_1e8;
  Maybe<capnp::MessageSize> local_1d8;
  Maybe<capnp::MessageSize> local_1c0;
  Maybe<capnp::MessageSize> local_1a8;
  TwoPartyVatNetwork local_190;
  
  kj::setupAsyncIo();
  callCount_00 = (int *)(local_5a5 + 1);
  local_5a5._1_4_ = 0;
  local_45c = 0;
  runServer(&local_578,local_4f8,callCount_00,&local_45c);
  receiveOptions._8_8_ = 0x40;
  receiveOptions.traversalLimitInWords = 0x800000;
  iVar10 = 0x40;
  __n = 0x800000;
  TwoPartyVatNetwork::TwoPartyVatNetwork(&local_190,local_578.pipe.ptr,CLIENT,receiveOptions);
  makeRpcClient<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>
            ((capnp *)&local_470,&local_190.super_TwoPartyVatNetworkBase);
  CVar12 = getPersistentCap((RpcSystem<capnp::rpc::twoparty::VatId> *)&local_558,(Side)&local_470,
                            TEST_INTERFACE);
  (*(local_558.super_PromiseBase.node.ptr)->_vptr_PromiseNode[4])
            (&local_348,local_558.super_PromiseBase.node.ptr,CVar12.hook.ptr);
  pPVar1 = local_558.super_PromiseBase.node.ptr;
  local_590._8_4_ = local_348.exception.ptr._0_4_;
  local_590._12_4_ = local_348.exception.ptr._4_4_;
  pCStack_580 = (CapTableBuilder *)local_348.exception.ptr.field_1.value.ownFile.content.ptr;
  local_590._0_8_ = &Capability::Client::typeinfo;
  if (local_558.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
    local_558.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_558.super_PromiseBase.node.disposer._4_4_,
                         local_558.super_PromiseBase.node.disposer._0_4_))
              ((undefined8 *)
               CONCAT44(local_558.super_PromiseBase.node.disposer._4_4_,
                        local_558.super_PromiseBase.node.disposer._0_4_),
               (_func_int *)((long)&pPVar1->_vptr_PromiseNode + (long)pPVar1->_vptr_PromiseNode[-2])
              );
  }
  local_1a8.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            (&local_3e8,(Client *)local_590,&local_1a8);
  *(undefined4 *)local_3e8.super_Builder._builder.data = 0x7b;
  *(byte *)((long)local_3e8.super_Builder._builder.data + 4) =
       *(byte *)((long)local_3e8.super_Builder._builder.data + 4) | 1;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)&stack0xfffffffffffffb58,(int)&local_3e8,__buf,__n,iVar10);
  local_1c0.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::bazRequest
            (&local_458,(Client *)local_590,&local_1c0);
  local_348.exception.ptr._0_8_ = local_458.super_Builder._builder.segment;
  local_348.exception.ptr.field_1.value.ownFile.content.ptr =
       (char *)local_458.super_Builder._builder.capTable;
  local_348.exception.ptr.field_1.value.ownFile.content.size_ =
       (size_t)local_458.super_Builder._builder.pointers;
  PointerBuilder::initStruct(&local_370,(PointerBuilder *)&local_348,(StructSize)0x140006);
  builder._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffb48;
  builder._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffb40;
  builder._builder.data = in_stack_fffffffffffffb50;
  builder._builder.pointers = (WirePointer *)in_stack_fffffffffffffb58;
  builder._builder._32_8_ = in_stack_fffffffffffffb60;
  initTestMessage(builder);
  Request<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
          *)&local_4e0,(int)&local_458,__buf_00,__n,iVar10);
  local_5a5[0] = '\0';
  local_1d8.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::barRequest
            (&local_420,(Client *)local_590,&local_1d8);
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
          *)&local_348,(int)&local_420,__buf_01,__n,iVar10);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)&local_348,
             kj::_::
             TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++:126:7),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++:128:10)>
             ::anon_class_1_0_00000001_for_func::operator());
  uVar9 = local_348.exception.ptr.field_1._32_8_;
  uVar8 = local_348.exception.ptr.field_1.value.file;
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00610c88;
  this_00[1].dependency.disposer = (Disposer *)local_5a5;
  local_5a0.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>,capnp::_::(anonymous_namespace)::TestCase100::run()::$_0,capnp::_::(anonymous_namespace)::TestCase100::run()::$_1>>
        ::instance;
  local_5a0.ptr = (PromiseNode *)this_00;
  if (local_348.exception.ptr.field_1.value.file != (char *)0x0) {
    local_348.exception.ptr.field_1.value.file = (char *)0x0;
    local_348.exception.ptr.field_1._32_8_ = (Disposer *)0x0;
    (***(_func_int ***)local_348.exception.ptr.field_1.value.description.content.ptr)
              (local_348.exception.ptr.field_1.value.description.content.ptr,uVar8,8,uVar9,uVar9,0);
  }
  uVar8 = local_348.exception.ptr.field_1.value.ownFile.content.disposer;
  if ((WirePointer *)local_348.exception.ptr.field_1.value.ownFile.content.disposer !=
      (WirePointer *)0x0) {
    local_348.exception.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)0x0;
    (**(code **)*(WirePointer *)local_348.exception.ptr.field_1.value.ownFile.content.size_)
              (local_348.exception.ptr.field_1.value.ownFile.content.size_,
               (long)&((WireValue<uint32_t>_conflict *)
                      &((ArrayDisposer *)uVar8)->_vptr_ArrayDisposer)->value +
               *(long *)(*(long *)&((ArrayDisposer *)uVar8)->_vptr_ArrayDisposer +
                        0xfffffffffffffff0));
  }
  uVar8 = local_348.exception.ptr.field_1.value.ownFile.content.ptr;
  if ((CapTableBuilder *)local_348.exception.ptr.field_1.value.ownFile.content.ptr !=
      (CapTableBuilder *)0x0) {
    local_348.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (*(code *)((SegmentReader *)local_348.exception.ptr._0_8_)->arena->_vptr_Arena)
              (local_348.exception.ptr._0_8_,
               (char *)(uVar8 + *(long *)((long)*(CapTableReader *)uVar8 + -0x10)));
  }
  if ((local_5a5._1_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_348.exception.ptr._0_8_ = local_348.exception.ptr._0_8_ & 0xffffffff00000000;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x84,ERROR,"\"failed: expected \" \"(0) == (callCount)\", 0, callCount",
               (char (*) [36])"failed: expected (0) == (callCount)",(int *)&local_348,callCount_00);
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            (&local_558,&stack0xfffffffffffffb58);
  bVar11 = local_534 == 0;
  local_348.exception.ptr.field_1.value.ownFile.content.size_ = (size_t)local_540;
  if (bVar11) {
    local_348.exception.ptr.field_1.value.ownFile.content.size_ = (size_t)(WirePointer *)0x0;
  }
  iVar10 = 0x7fffffff;
  if (!bVar11) {
    iVar10 = local_530;
  }
  local_348.exception.ptr._0_4_ = 0;
  local_348.exception.ptr._4_4_ = 0;
  local_348.exception.ptr.field_1._0_4_ = 0;
  local_348.exception.ptr.field_1._4_4_ = 0;
  if (!bVar11) {
    local_348.exception.ptr._0_4_ = local_558.super_PromiseBase.node.disposer._0_4_;
    local_348.exception.ptr._4_4_ = local_558.super_PromiseBase.node.disposer._4_4_;
    local_348.exception.ptr.field_1._0_4_ = local_558.super_PromiseBase.node.ptr._0_4_;
    local_348.exception.ptr.field_1._4_4_ = local_558.super_PromiseBase.node.ptr._4_4_;
  }
  local_348.exception.ptr.field_1._16_4_ = iVar10;
  RVar13 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_348,(void *)0x0,0);
  if (((RVar13.super_StringPtr.content.size_ != 4) ||
      ((char)RVar13.super_StringPtr.content.ptr[1] != 'o' ||
       *RVar13.super_StringPtr.content.ptr != 0x6f66)) && (kj::_::Debug::minSeverity < 3)) {
    bVar11 = local_534 == 0;
    local_348.exception.ptr.field_1.value.ownFile.content.size_ = (size_t)local_540;
    if (bVar11) {
      local_348.exception.ptr.field_1.value.ownFile.content.size_ = (size_t)(WirePointer *)0x0;
    }
    local_348.exception.ptr.field_1._16_4_ = 0x7fffffff;
    if (!bVar11) {
      local_348.exception.ptr.field_1._16_4_ = local_530;
    }
    local_348.exception.ptr._0_4_ = 0;
    local_348.exception.ptr._4_4_ = 0;
    local_348.exception.ptr.field_1._0_4_ = 0;
    local_348.exception.ptr.field_1._4_4_ = 0;
    if (!bVar11) {
      local_348.exception.ptr._0_4_ = local_558.super_PromiseBase.node.disposer._0_4_;
      local_348.exception.ptr._4_4_ = local_558.super_PromiseBase.node.disposer._4_4_;
      local_348.exception.ptr.field_1._0_4_ = local_558.super_PromiseBase.node.ptr._0_4_;
      local_348.exception.ptr.field_1._4_4_ = local_558.super_PromiseBase.node.ptr._4_4_;
    }
    local_3b0[0] = (ArrayPtr<const_char>)
                   PointerReader::getBlob<capnp::Text>((PointerReader *)&local_348,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[47],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x88,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (response1.getX())\", \"foo\", response1.getX()"
               ,(char (*) [47])"failed: expected (\"foo\") == (response1.getX())",
               (char (*) [4])0x4da3ec,(Reader *)local_3b0);
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BazResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BazResults>_> *)
             local_3b0,&local_4e0);
  local_348.exception.ptr._0_8_ = local_348.exception.ptr._0_8_ & 0xffffffffffffff00;
  local_1e8 = '\0';
  kj::_::waitImpl(&local_5a0,&local_348,local_4f0);
  if (local_1e8 == '\x01') {
    if (local_348.exception.ptr.isSet != false) {
      kj::throwRecoverableException(&local_348.exception.ptr.field_1.value,0);
    }
  }
  else {
    if (local_348.exception.ptr.isSet == false) {
      kj::_::unreachable();
    }
    kj::throwRecoverableException(&local_348.exception.ptr.field_1.value,0);
  }
  if (local_348.exception.ptr.isSet == true) {
    kj::Exception::~Exception(&local_348.exception.ptr.field_1.value);
  }
  if (local_5a5._1_4_ != 2 && kj::_::Debug::minSeverity < 3) {
    local_348.exception.ptr._0_4_ = 2;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x8e,ERROR,"\"failed: expected \" \"(2) == (callCount)\", 2, callCount",
               (char (*) [36])"failed: expected (2) == (callCount)",(int *)&local_348,callCount_00);
  }
  if ((local_5a5[0] == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[27]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x8f,ERROR,"\"failed: expected \" \"barFailed\"",
               (char (*) [27])"failed: expected barFailed");
  }
  plVar4 = local_378;
  if (local_378 != (long *)0x0) {
    local_378 = (long *)0x0;
    (**(code **)*local_380)(local_380,(long)plVar4 + *(long *)(*plVar4 + -0x10));
  }
  plVar4 = local_520;
  if (local_520 != (long *)0x0) {
    local_520 = (long *)0x0;
    (**(code **)*local_528)(local_528,(long)plVar4 + *(long *)(*plVar4 + -0x10));
  }
  pPVar1 = local_5a0.ptr;
  if ((TransformPromiseNodeBase *)local_5a0.ptr != (TransformPromiseNodeBase *)0x0) {
    local_5a0.ptr = (PromiseNode *)0x0;
    (**(local_5a0.disposer)->_vptr_Disposer)
              (local_5a0.disposer,
               (_func_int *)
               ((long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode +
               (long)((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2]));
  }
  pRVar7 = local_420.hook.ptr;
  if (local_420.hook.ptr != (RequestHook *)0x0) {
    local_420.hook.ptr = (RequestHook *)0x0;
    (**(local_420.hook.disposer)->_vptr_Disposer)
              (local_420.hook.disposer,
               (_func_int *)((long)&pRVar7->_vptr_RequestHook + (long)pRVar7->_vptr_RequestHook[-2])
              );
  }
  if (in_stack_fffffffffffffb40 != 0) {
    (**in_stack_fffffffffffffb50->_vptr_RequestHook)
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb40,8,in_stack_fffffffffffffb48,
               in_stack_fffffffffffffb48,0);
  }
  pWVar6 = local_4c8;
  if (local_4c8 != (WirePointer *)0x0) {
    local_4c8 = (WirePointer *)0x0;
    (**(code **)*local_4d0)
              (local_4d0,(long)&(pWVar6->offsetAndKind).value + *(long *)((long)*pWVar6 + -0x10));
  }
  pCVar2 = local_4d8;
  if (local_4d8 != (CapTableBuilder *)0x0) {
    local_4d8 = (CapTableBuilder *)0x0;
    (*(code *)((local_4e0->super_SegmentReader).arena)->_vptr_Arena)
              (local_4e0,
               (_func_int *)
               ((long)&(pCVar2->super_CapTableReader)._vptr_CapTableReader +
               (long)(pCVar2->super_CapTableReader)._vptr_CapTableReader[-2]));
  }
  pRVar7 = local_458.hook.ptr;
  if (local_458.hook.ptr != (RequestHook *)0x0) {
    local_458.hook.ptr = (RequestHook *)0x0;
    (**(local_458.hook.disposer)->_vptr_Disposer)
              (local_458.hook.disposer,
               (_func_int *)((long)&pRVar7->_vptr_RequestHook + (long)pRVar7->_vptr_RequestHook[-2])
              );
  }
  if (local_488 != 0) {
    (**local_478->_vptr_RequestHook)(local_478,local_488,8,pDStack_480,pDStack_480,0);
  }
  if (local_490 != (WirePointer *)0x0) {
    (**(code **)*local_498)
              (local_498,
               (long)&(local_490->offsetAndKind).value + *(long *)((long)*local_490 + -0x10));
  }
  if (in_stack_fffffffffffffb60 != (CapTableBuilder *)0x0) {
    (*(code *)((in_stack_fffffffffffffb58->super_SegmentReader).arena)->_vptr_Arena)
              (in_stack_fffffffffffffb58,
               (_func_int *)
               ((long)&(in_stack_fffffffffffffb60->super_CapTableReader)._vptr_CapTableReader +
               (long)(in_stack_fffffffffffffb60->super_CapTableReader)._vptr_CapTableReader[-2]));
  }
  pRVar7 = local_3e8.hook.ptr;
  if (local_3e8.hook.ptr != (RequestHook *)0x0) {
    local_3e8.hook.ptr = (RequestHook *)0x0;
    (**(local_3e8.hook.disposer)->_vptr_Disposer)
              (local_3e8.hook.disposer,
               (_func_int *)((long)&pRVar7->_vptr_RequestHook + (long)pRVar7->_vptr_RequestHook[-2])
              );
  }
  pCVar2 = pCStack_580;
  if (pCStack_580 != (CapTableBuilder *)0x0) {
    pCStack_580 = (CapTableBuilder *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_590._12_4_,local_590._8_4_))
              ((undefined8 *)CONCAT44(local_590._12_4_,local_590._8_4_),
               (long)&pCVar2->super_CapTableReader +
               *(long *)((long)pCVar2->super_CapTableReader + -0x10));
  }
  RpcSystemBase::~RpcSystemBase(&local_470);
  TwoPartyVatNetwork::~TwoPartyVatNetwork(&local_190);
  pAVar3 = local_578.pipe.ptr;
  if (local_578.pipe.ptr != (AsyncIoStream *)0x0) {
    local_578.pipe.ptr = (AsyncIoStream *)0x0;
    (**(local_578.pipe.disposer)->_vptr_Disposer)
              (local_578.pipe.disposer,
               (_func_int *)
               ((long)&(pAVar3->super_AsyncInputStream)._vptr_AsyncInputStream +
               (long)(pAVar3->super_AsyncInputStream)._vptr_AsyncInputStream[-2]));
  }
  if (local_578.thread.ptr != (Thread *)0x0) {
    local_578.thread.ptr = (Thread *)0x0;
    (**(local_578.thread.disposer)->_vptr_Disposer)();
  }
  pAVar5 = local_4f8;
  if (local_4f8 != (AsyncIoProvider *)0x0) {
    local_4f8 = (AsyncIoProvider *)0x0;
    (**(code **)*local_500)
              (local_500,
               (_func_int *)
               ((long)&pAVar5->_vptr_AsyncIoProvider + (long)pAVar5->_vptr_AsyncIoProvider[-2]));
  }
  plVar4 = local_508;
  if (local_508 != (long *)0x0) {
    local_508 = (long *)0x0;
    (**(code **)*local_510)(local_510,(long)plVar4 + *(long *)(*plVar4 + -0x10));
  }
  return;
}

Assistant:

TEST(TwoPartyNetwork, Basic) {
  auto ioContext = kj::setupAsyncIo();
  int callCount = 0;
  int handleCount = 0;

  auto serverThread = runServer(*ioContext.provider, callCount, handleCount);
  TwoPartyVatNetwork network(*serverThread.pipe, rpc::twoparty::Side::CLIENT);
  auto rpcClient = makeRpcClient(network);

  // Request the particular capability from the server.
  auto client = getPersistentCap(rpcClient, rpc::twoparty::Side::SERVER,
      test::TestSturdyRefObjectId::Tag::TEST_INTERFACE).castAs<test::TestInterface>();

  // Use the capability.
  auto request1 = client.fooRequest();
  request1.setI(123);
  request1.setJ(true);
  auto promise1 = request1.send();

  auto request2 = client.bazRequest();
  initTestMessage(request2.initS());
  auto promise2 = request2.send();

  bool barFailed = false;
  auto request3 = client.barRequest();
  auto promise3 = request3.send().then(
      [](Response<test::TestInterface::BarResults>&& response) {
        ADD_FAILURE() << "Expected bar() call to fail.";
      }, [&](kj::Exception&& e) {
        barFailed = true;
      });

  EXPECT_EQ(0, callCount);

  auto response1 = promise1.wait(ioContext.waitScope);

  EXPECT_EQ("foo", response1.getX());

  auto response2 = promise2.wait(ioContext.waitScope);

  promise3.wait(ioContext.waitScope);

  EXPECT_EQ(2, callCount);
  EXPECT_TRUE(barFailed);
}